

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_tests.cpp
# Opt level: O1

void __thiscall afsm::test::Pushdown_EmptyArray_Test::TestBody(Pushdown_EmptyArray_Test *this)

{
  bool bVar1;
  event_process_result eVar2;
  _Elt_pointer prVar3;
  char *pcVar4;
  char *in_R9;
  internal iVar5;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  json_parser_fsm fsm;
  AssertHelper local_1b8;
  AssertHelper local_1b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  string local_198;
  state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
  local_178;
  
  state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
  ::state_machine(&local_178);
  local_198._M_dataplus._M_p._0_1_ = '\x01';
  local_198._M_string_length = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_198._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  prVar3 = local_178.
           super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
           .
           super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
           .regions_.state_stack_.
           super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_178.
      super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
      .
      super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
      .regions_.state_stack_.
      super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_178.
      super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
      .
      super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
      .regions_.state_stack_.
      super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    prVar3 = local_178.
             super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
             .super_type.
             super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
             .
             super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
             .regions_.state_stack_.
             super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 3;
  }
  iVar5 = (internal)
          (*(size_type *)
            ((long)&prVar3[-1].regions_.
                    super__Tuple_impl<0UL,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
                    .
                    super__Head_base<0UL,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_false>
                    ._M_head_impl.
                    super_state_machine_base<afsm::test::json_parser_def::context,_afsm::none,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
                    .super_type.
                    super_transition_container<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>
            + 8) == 0);
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1a8.ptr_._0_1_ = iVar5;
  if (!(bool)iVar5) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1a8,
               (AssertionResult *)"fsm.is_in_state<json_parser_fsm::context::start>()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/pushdown_tests.cpp"
               ,0x14c,(char *)CONCAT71(local_198._M_dataplus._M_p._1_7_,
                                       (char)local_198._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_198._M_dataplus._M_p._1_7_,(char)local_198._M_dataplus._M_p) !=
        &local_198.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_198._M_dataplus._M_p._1_7_,(char)local_198._M_dataplus._M_p),
                      local_198.field_2._M_allocated_capacity + 1);
    }
    if (local_1b8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1b8.data_ + 8))();
      }
      local_1b8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  eVar2 = state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::start_array>(&local_178,(start_array *)&local_198);
  local_1a8.ptr_._0_1_ = (internal)((eVar2 & ~defer) == process_in_state);
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_1a8.ptr_._0_1_) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1a8,
               (AssertionResult *)"done(fsm.process_event(events::start_array{}))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/pushdown_tests.cpp"
               ,0x14d,(char *)CONCAT71(local_198._M_dataplus._M_p._1_7_,
                                       (char)local_198._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_198._M_dataplus._M_p._1_7_,(char)local_198._M_dataplus._M_p) !=
        &local_198.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_198._M_dataplus._M_p._1_7_,(char)local_198._M_dataplus._M_p),
                      local_198.field_2._M_allocated_capacity + 1);
    }
    if (local_1b8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1b8.data_ + 8))();
      }
      local_1b8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  prVar3 = local_178.
           super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
           .
           super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
           .regions_.state_stack_.
           super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_178.
      super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
      .
      super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
      .regions_.state_stack_.
      super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_178.
      super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
      .
      super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
      .regions_.state_stack_.
      super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    prVar3 = local_178.
             super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
             .super_type.
             super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
             .
             super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
             .regions_.state_stack_.
             super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 3;
  }
  local_1a8.ptr_._0_1_ =
       (internal)
       (*(size_type *)
         ((long)&prVar3[-1].regions_.
                 super__Tuple_impl<0UL,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
                 .
                 super__Head_base<0UL,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_false>
                 ._M_head_impl.
                 super_state_machine_base<afsm::test::json_parser_def::context,_afsm::none,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
                 .super_type.
                 super_transition_container<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>
         + 8) == 0);
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_1a8.ptr_._0_1_) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1a8,
               (AssertionResult *)"fsm.is_in_state<json_parser_fsm::context::start>()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/pushdown_tests.cpp"
               ,0x14e,(char *)CONCAT71(local_198._M_dataplus._M_p._1_7_,
                                       (char)local_198._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_198._M_dataplus._M_p._1_7_,(char)local_198._M_dataplus._M_p) !=
        &local_198.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_198._M_dataplus._M_p._1_7_,(char)local_198._M_dataplus._M_p),
                      local_198.field_2._M_allocated_capacity + 1);
    }
    if (local_1b8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1b8.data_ + 8))();
      }
      local_1b8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_1b8.data_ =
       (AssertHelperData *)
       (((long)local_178.
               super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
               .super_type.
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
               .
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
               .regions_.state_stack_.
               super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)local_178.
               super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
               .super_type.
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
               .
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
               .regions_.state_stack_.
               super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * -0x71c71c71c71c71c7 +
       ((long)local_178.
              super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              .super_type.
              super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
              .
              super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
              .regions_.state_stack_.
              super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
        (long)local_178.
              super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              .super_type.
              super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
              .
              super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
              .regions_.state_stack_.
              super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) * -0x71c71c71c71c71c7 +
       (((long)local_178.
               super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
               .super_type.
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
               .
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
               .regions_.state_stack_.
               super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node -
         (long)local_178.
               super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
               .super_type.
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
               .
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
               .regions_.state_stack_.
               super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
       (ulong)(local_178.
               super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
               .super_type.
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
               .
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
               .regions_.state_stack_.
               super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 3);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_198,"2UL","fsm.stack_size()",(unsigned_long *)&local_1a8,
             (unsigned_long *)&local_1b8);
  if ((char)local_198._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1a8);
    if ((undefined8 *)local_198._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_198._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/pushdown_tests.cpp"
               ,0x14f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if (local_1a8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_1a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1a8.ptr_ + 8))();
      }
      local_1a8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_198._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  eVar2 = state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::end_array>(&local_178,(end_array *)&local_198);
  bVar1 = (eVar2 & ~defer) == process_in_state;
  local_1a8.ptr_._0_1_ = (internal)bVar1;
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1a8,
               (AssertionResult *)"done(fsm.process_event(events::end_array{}))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/pushdown_tests.cpp"
               ,0x151,(char *)CONCAT71(local_198._M_dataplus._M_p._1_7_,
                                       (char)local_198._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_198._M_dataplus._M_p._1_7_,(char)local_198._M_dataplus._M_p) !=
        &local_198.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_198._M_dataplus._M_p._1_7_,(char)local_198._M_dataplus._M_p),
                      local_198.field_2._M_allocated_capacity + 1);
    }
    if (local_1b8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1b8.data_ + 8))();
      }
      local_1b8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_1b8.data_ =
       (AssertHelperData *)
       (((long)local_178.
               super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
               .super_type.
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
               .
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
               .regions_.state_stack_.
               super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)local_178.
               super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
               .super_type.
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
               .
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
               .regions_.state_stack_.
               super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * -0x71c71c71c71c71c7 +
       ((long)local_178.
              super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              .super_type.
              super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
              .
              super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
              .regions_.state_stack_.
              super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
        (long)local_178.
              super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              .super_type.
              super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
              .
              super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
              .regions_.state_stack_.
              super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) * -0x71c71c71c71c71c7 +
       (((long)local_178.
               super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
               .super_type.
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
               .
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
               .regions_.state_stack_.
               super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node -
         (long)local_178.
               super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
               .super_type.
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
               .
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
               .regions_.state_stack_.
               super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
       (ulong)(local_178.
               super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
               .super_type.
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
               .
               super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
               .regions_.state_stack_.
               super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 3);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_198,"1UL","fsm.stack_size()",(unsigned_long *)&local_1a8,
             (unsigned_long *)&local_1b8);
  if ((char)local_198._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1a8);
    if ((undefined8 *)local_198._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_198._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/pushdown_tests.cpp"
               ,0x152,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if (local_1a8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_1a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1a8.ptr_ + 8))();
      }
      local_1a8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_198._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_178.
      super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
      .
      super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
      .regions_.state_stack_.
      super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_178.
      super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
      .
      super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
      .regions_.state_stack_.
      super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    local_178.
    super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
    .super_type.
    super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
    .
    super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
    .regions_.state_stack_.
    super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_178.
         super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
         .super_type.
         super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
         .
         super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
         .regions_.state_stack_.
         super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 3;
  }
  bVar1 = *(size_type *)
           ((long)&local_178.
                   super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                   .super_type.
                   super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
                   .
                   super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
                   .regions_.state_stack_.
                   super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].regions_.
                   super__Tuple_impl<0UL,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
                   .
                   super__Head_base<0UL,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_false>
                   ._M_head_impl.
                   super_state_machine_base<afsm::test::json_parser_def::context,_afsm::none,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
                   .super_type.
                   super_transition_container<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>
           + 8) == 3;
  local_1a8.ptr_._0_1_ = (internal)bVar1;
  local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1a8,
               (AssertionResult *)"fsm.is_in_state<json_parser_fsm::context::end>()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/pushdown_tests.cpp"
               ,0x153,(char *)CONCAT71(local_198._M_dataplus._M_p._1_7_,
                                       (char)local_198._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_198._M_dataplus._M_p._1_7_,(char)local_198._M_dataplus._M_p) !=
        &local_198.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_198._M_dataplus._M_p._1_7_,(char)local_198._M_dataplus._M_p),
                      local_198.field_2._M_allocated_capacity + 1);
    }
    if (local_1b8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1b8.data_ + 8))();
      }
      local_1b8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_178.deferred_event_ids_._M_t);
  std::__cxx11::
  _List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ::_M_clear(&local_178.deferred_events_.
              super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            );
  std::
  deque<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ::~deque(&local_178.queued_events_);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_178.deferred_._M_t);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_178.handled_._M_t);
  std::
  _Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
  ::~_Deque_base((_Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
                  *)((long)&local_178.
                            super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                            .super_type.
                            super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
                            .
                            super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
                            .regions_ + 8));
  return;
}

Assistant:

TEST(Pushdown, EmptyArray)
{
    json_parser_fsm fsm;

    EXPECT_TRUE(fsm.is_in_state<json_parser_def>());
    EXPECT_TRUE(fsm.is_in_state<json_parser_fsm::context::start>());
    EXPECT_TRUE(done(fsm.process_event(events::start_array{})));
    EXPECT_TRUE(fsm.is_in_state<json_parser_fsm::context::start>());
    EXPECT_EQ(2UL, fsm.stack_size());

    EXPECT_TRUE(done(fsm.process_event(events::end_array{})));
    EXPECT_EQ(1UL, fsm.stack_size());
    EXPECT_TRUE(fsm.is_in_state<json_parser_fsm::context::end>());
}